

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int DisconnectIM483Ix(IM483I *pIM483I)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((IM483I *)addrsIM483I[lVar2] == pIM483I) {
      iVar1 = DisconnectIM483I(pIM483I);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsIM483I[lVar2] = (void *)0x0;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectIM483Ix(IM483I* pIM483I)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectIM483I(pIM483I);
	if (res != EXIT_SUCCESS) return res;

	addrsIM483I[id] = NULL;

	return EXIT_SUCCESS;
}